

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O2

void __thiscall lightconf::scanner::expect(scanner *this,char c,bool optional)

{
  token *tok;
  string sStack_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [48];
  char local_b8;
  undefined1 local_a8 [60];
  int local_6c;
  undefined1 local_68 [56];
  int local_30;
  
  peek_token((token *)local_e8,this);
  std::__cxx11::string::~string((string *)(local_e8 + 8));
  if ((local_e8._0_4_ == char_token) && (local_b8 == c)) {
    skip_whitespace(this,false);
    next_token(this);
  }
  else if (!optional) {
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_168,'\x01');
    std::operator+(&local_148,"expected \'",&local_168);
    std::operator+(&local_128,&local_148,"\' but found ");
    cur_token((token *)local_e8,this);
    token_name_abi_cxx11_(&sStack_188,(lightconf *)local_e8,tok);
    std::operator+(&local_108,&local_128,&sStack_188);
    cur_token((token *)local_68,this);
    cur_token((token *)local_a8,this);
    fail(this,&local_108,local_30,local_6c);
    std::__cxx11::string::~string((string *)(local_a8 + 8));
    std::__cxx11::string::~string((string *)(local_68 + 8));
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&sStack_188);
    std::__cxx11::string::~string((string *)(local_e8 + 8));
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
  }
  return;
}

Assistant:

inline void scanner::expect(char c, bool optional) {
    if (peek_token().is_char(c)) {
        skip_whitespace(false);
        next_token();
    } else {
        if (!optional) {
            fail("expected '" + std::string(1, c) + "' but found " + token_name(cur_token()),
                cur_token().line, cur_token().col);
        }
    }
}